

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Admin.h
# Opt level: O1

void __thiscall Admin::resizeRooms(Admin *this)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  Room *pRVar3;
  undefined1 auVar4 [16];
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  University *pUVar8;
  Room *pRVar9;
  void *pvVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  
  pUVar8 = Innopolis;
  iVar12 = Innopolis->rooms_count;
  uVar15 = (ulong)(iVar12 * 2);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar15;
  uVar14 = 0xffffffffffffffff;
  if (SUB168(auVar4 * ZEXT816(0x28),8) == 0) {
    uVar14 = SUB168(auVar4 * ZEXT816(0x28),0);
  }
  pRVar9 = (Room *)operator_new__(uVar14);
  if (iVar12 != 0) {
    lVar13 = 0;
    do {
      *(undefined8 *)((long)&pRVar9->standardAccess + lVar13) = 1;
      *(undefined4 *)((long)&pRVar9->specialAccessedUsers_count + lVar13) = 1;
      pvVar10 = operator_new__(4);
      *(void **)((long)&pRVar9->specialAccessedUsers + lVar13) = pvVar10;
      lVar13 = lVar13 + 0x28;
    } while (uVar15 * 0x28 != lVar13);
  }
  iVar12 = pUVar8->rooms_count;
  if (0 < iVar12) {
    lVar13 = 0;
    lVar11 = 0;
    do {
      pRVar3 = pUVar8->rooms;
      *(undefined4 *)((long)&pRVar9->room_id + lVar13) =
           *(undefined4 *)((long)&pRVar3->room_id + lVar13);
      puVar1 = (undefined8 *)((long)&pRVar3->name + lVar13);
      uVar5 = *puVar1;
      uVar6 = puVar1[1];
      puVar1 = (undefined8 *)((long)&pRVar3->specialAccessedUsers_count + lVar13);
      uVar7 = puVar1[1];
      puVar2 = (undefined8 *)((long)&pRVar9->specialAccessedUsers_count + lVar13);
      *puVar2 = *puVar1;
      puVar2[1] = uVar7;
      puVar1 = (undefined8 *)((long)&pRVar9->name + lVar13);
      *puVar1 = uVar5;
      puVar1[1] = uVar6;
      lVar11 = lVar11 + 1;
      iVar12 = pUVar8->rooms_count;
      lVar13 = lVar13 + 0x28;
    } while (lVar11 < iVar12);
  }
  pUVar8->rooms_count = iVar12 * 2;
  pUVar8->rooms = pRVar9;
  return;
}

Assistant:

void resizeRooms(){
        Room* resizesRoomList = new Room[Innopolis->rooms_count*2];
        for(int i=0;i<Innopolis->rooms_count;i++){
            resizesRoomList[i] = Innopolis->rooms[i];
        }
        Innopolis->rooms_count<<=1;
        Innopolis->rooms = resizesRoomList;
    }